

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,...),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,_func_void_ptr_RecyclableObject_ptr_CallInfo_varargs **key,
          JavascriptFunction **value)

{
  BaseDictionary<void*(*)(Js::RecyclableObject*,Js::CallInfo,___),Js::JavascriptFunction*,Memory::Recycler,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  long lVar7;
  uint uVar8;
  WriteBarrierPtr<Js::JavascriptFunction> *pWVar9;
  int iVar10;
  uint hashCode;
  long lVar11;
  WriteBarrierPtr<Js::JavascriptFunction> local_68;
  _func_void_ptr_RecyclableObject_ptr_CallInfo_varargs **local_60;
  long local_58;
  WriteBarrierPtr<Js::JavascriptFunction> *local_50;
  WriteBarrierPtr<Js::JavascriptFunction> local_48;
  JavascriptFunction **local_40;
  uint local_34;
  
  lVar7 = *(long *)this;
  local_40 = value;
  if (lVar7 == 0) {
    BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar7 = *(long *)this;
  }
  hashCode = (uint)((ulong)*key >> 3) | 1;
  local_34 = BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket((BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          *)this,hashCode);
  pWVar9 = (WriteBarrierPtr<Js::JavascriptFunction> *)(lVar7 + (ulong)local_34 * 4);
  uVar8 = 0;
  while( true ) {
    iVar10 = *(int *)&pWVar9->ptr;
    local_60 = key;
    if ((long)iVar10 < 0) break;
    lVar7 = (long)iVar10 * 0x18;
    pWVar9 = (WriteBarrierPtr<Js::JavascriptFunction> *)(*(long *)(this + 8) + lVar7);
    if (*(_func_void_ptr_RecyclableObject_ptr_CallInfo_varargs **)
         (*(long *)(this + 8) + 0x10 + lVar7) == *key) {
      if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar8);
      }
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet(&local_48,*local_40);
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet(pWVar9,local_48.ptr);
      return iVar10;
    }
    uVar8 = uVar8 + 1;
    pWVar9 = pWVar9 + 1;
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar8);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar5 = *(int *)(this + 0x18);
    iVar10 = *(int *)(this + 0x20);
    if (iVar10 == iVar5) {
      BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_34 = BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket((BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,____),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              *)this,hashCode);
      iVar5 = *(int *)(this + 0x18);
      iVar10 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar10 + 1;
    if (iVar5 < iVar10 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar4) goto LAB_00703646;
      *puVar6 = 0;
      iVar5 = *(int *)(this + 0x18);
    }
    if (iVar5 <= iVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar4) goto LAB_00703646;
      *puVar6 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar4) goto LAB_00703646;
      *puVar6 = 0;
    }
    iVar10 = *(int *)(this + 0x24);
    if (iVar10 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar4) goto LAB_00703646;
      *puVar6 = 0;
      iVar10 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar4) {
LAB_00703646:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
      iVar10 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar5 = BaseDictionary<void_*(*)(Js::RecyclableObject_*,_Js::CallInfo,_...),_Js::JavascriptFunction_*,_Memory::Recycler,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar10 * 0x18 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar5;
    }
  }
  lVar7 = *(long *)(this + 8);
  local_58 = (long)iVar10;
  lVar11 = local_58 * 0x18;
  local_50 = (WriteBarrierPtr<Js::JavascriptFunction> *)(lVar7 + lVar11);
  Memory::WriteBarrierPtr<void_*(Js::RecyclableObject_*,_Js::CallInfo,_...)>::WriteBarrierSet
            ((WriteBarrierPtr<void_*(Js::RecyclableObject_*,_Js::CallInfo,____)> *)&local_48,
             *local_60);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet(&local_68,*local_40);
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet(local_50,local_68.ptr);
  Memory::WriteBarrierPtr<void_*(Js::RecyclableObject_*,_Js::CallInfo,_...)>::WriteBarrierSet
            ((WriteBarrierPtr<void_*(Js::RecyclableObject_*,_Js::CallInfo,____)> *)
             (lVar7 + lVar11 + 0x10),
             (_func_void_ptr_RecyclableObject_ptr_CallInfo_varargs *)local_48.ptr);
  lVar7 = *(long *)this;
  lVar2 = *(long *)(this + 8);
  *(undefined4 *)(lVar2 + 8 + lVar11) = *(undefined4 *)(lVar7 + (ulong)local_34 * 4);
  *(int *)(lVar7 + (ulong)local_34 * 4) = (int)local_58;
  uVar8 = 0;
  iVar5 = iVar10;
  do {
    iVar5 = *(int *)(lVar2 + 8 + (long)iVar5 * 0x18);
    uVar8 = uVar8 + 1;
  } while (iVar5 != -1);
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar8);
  }
  return iVar10;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }